

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature.hpp
# Opt level: O2

signature_element *
boost::python::detail::signature_arity<2U>::
impl<boost::mpl::vector3<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_AbstractModuleClient_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::elements(void)

{
  int iVar1;
  char *raw_name;
  
  if (signature_arity<2u>::
      impl<boost::mpl::vector3<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,AbstractModuleClient&,std::__cxx11::string>>
      ::elements()::result == '\0') {
    iVar1 = __cxa_guard_acquire(&signature_arity<2u>::
                                 impl<boost::mpl::vector3<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,AbstractModuleClient&,std::__cxx11::string>>
                                 ::elements()::result);
    if (iVar1 != 0) {
      elements::result[0].basename =
           (char *)gcc_demangle(
                               "St6vectorINSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEESaIS5_EE"
                               );
      elements::result[0].pytype_f =
           converter::
           expected_pytype_for_arg<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::get_pytype;
      elements::result[0].lvalue = false;
      elements::result[1].basename = (char *)gcc_demangle("20AbstractModuleClient");
      elements::result[1].pytype_f =
           converter::expected_pytype_for_arg<AbstractModuleClient_&>::get_pytype;
      elements::result[1].lvalue = true;
      elements::result[2].basename =
           (char *)gcc_demangle("NSt7__cxx1112basic_stringIcSt11char_traitsIcESaIcEEE");
      elements::result[2].pytype_f =
           converter::
           expected_pytype_for_arg<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::get_pytype;
      elements::result[2].lvalue = false;
      elements::result[3].basename = (char *)0x0;
      elements::result[3].pytype_f = (pytype_function)0x0;
      elements::result[3].lvalue = false;
      elements::result[3]._17_7_ = 0;
      __cxa_guard_release(&signature_arity<2u>::
                           impl<boost::mpl::vector3<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,AbstractModuleClient&,std::__cxx11::string>>
                           ::elements()::result);
    }
  }
  return elements::result;
}

Assistant:

static signature_element const* elements()
        {
            static signature_element const result[N+2] = {
                
#ifndef BOOST_PYTHON_NO_PY_SIGNATURES
# define BOOST_PP_LOCAL_MACRO(i)                                                            \
                {                                                                           \
                  type_id<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>().name()           \
                  , &converter::expected_pytype_for_arg<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::get_pytype   \
                  , indirect_traits::is_reference_to_non_const<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::value \
                },
#else
# define BOOST_PP_LOCAL_MACRO(i)                                                            \
                {                                                                           \
                  type_id<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>().name()           \
                  , 0 \
                  , indirect_traits::is_reference_to_non_const<BOOST_DEDUCED_TYPENAME mpl::at_c<Sig,i>::type>::value \
                },
#endif
                
# define BOOST_PP_LOCAL_LIMITS (0, N)
# include BOOST_PP_LOCAL_ITERATE()
                {0,0,0}
            };
            return result;
        }